

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O1

REF_STATUS
ref_subdiv_node_between(REF_SUBDIV ref_subdiv,REF_INT node0,REF_INT node1,REF_INT *new_node)

{
  uint uVar1;
  REF_INT edge;
  int local_1c;
  
  *new_node = -1;
  uVar1 = ref_edge_with(ref_subdiv->edge,node0,node1,&local_1c);
  if (uVar1 == 0) {
    *new_node = ref_subdiv->node[local_1c];
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x130,
           "ref_subdiv_node_between",(ulong)uVar1,"missing edge");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_node_between(REF_SUBDIV ref_subdiv,
                                                  REF_INT node0, REF_INT node1,
                                                  REF_INT *new_node) {
  REF_INT edge;

  (*new_node) = REF_EMPTY;

  RSS(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge),
      "missing edge");

  (*new_node) = ref_subdiv_node(ref_subdiv, edge);

  return REF_SUCCESS;
}